

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

void socketio_destroy(CONCRETE_IO_HANDLE socket_io)

{
  undefined8 *__ptr;
  PENDING_SOCKET_IO *pending_socket_io;
  LIST_ITEM_HANDLE first_pending_io;
  SOCKET_IO_INSTANCE *socket_io_instance;
  CONCRETE_IO_HANDLE socket_io_local;
  
  if (socket_io != (CONCRETE_IO_HANDLE)0x0) {
    if (*socket_io != -1) {
      close(*socket_io);
    }
    pending_socket_io =
         (PENDING_SOCKET_IO *)
         singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58));
    while (pending_socket_io != (PENDING_SOCKET_IO *)0x0) {
      __ptr = (undefined8 *)singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)pending_socket_io);
      if (__ptr != (undefined8 *)0x0) {
        free((void *)*__ptr);
        free(__ptr);
      }
      singlylinkedlist_remove
                (*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58),
                 (LIST_ITEM_HANDLE)pending_socket_io);
      pending_socket_io =
           (PENDING_SOCKET_IO *)
           singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58));
    }
    destroy_socket_io_instance((SOCKET_IO_INSTANCE *)socket_io);
  }
  return;
}

Assistant:

void socketio_destroy(CONCRETE_IO_HANDLE socket_io)
{
    if (socket_io != NULL)
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;
        /* we cannot do much if the close fails, so just ignore the result */
        if (socket_io_instance->socket != INVALID_SOCKET)
        {
            close(socket_io_instance->socket);
        }

        /* clear allpending IOs */
        LIST_ITEM_HANDLE first_pending_io = singlylinkedlist_get_head_item(socket_io_instance->pending_io_list);
        while (first_pending_io != NULL)
        {
            PENDING_SOCKET_IO* pending_socket_io = (PENDING_SOCKET_IO*)singlylinkedlist_item_get_value(first_pending_io);
            if (pending_socket_io != NULL)
            {
                free(pending_socket_io->bytes);
                free(pending_socket_io);
            }

            (void)singlylinkedlist_remove(socket_io_instance->pending_io_list, first_pending_io);
            first_pending_io = singlylinkedlist_get_head_item(socket_io_instance->pending_io_list);
        }

        destroy_socket_io_instance(socket_io_instance);
    }
}